

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  Repeat RVar5;
  cmValue cVar6;
  ostream *poVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  string *op;
  string_view value;
  string_view value_00;
  optional<unsigned_long> level;
  optional<unsigned_long> level_00;
  string_view value_01;
  unsigned_long plevel;
  unsigned_long n;
  RegularExpression repeatRegex;
  ostringstream cmCTestLog_msg;
  _Storage<unsigned_long,_true> local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  unsigned_long local_3d8;
  undefined1 local_3d0 [112];
  ios_base local_360 [152];
  char *local_2c8;
  char *local_2c0;
  char *local_1c0;
  char *local_1b0;
  int local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  pcVar1 = local_3d0 + 0x10;
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"TestsToRunInformation","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  SetTestsToRunInformation(this,cVar6);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"UseUnion","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  if (cVar6.Value == (string *)0x0) {
    bVar3 = false;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value);
  }
  this->UseUnion = bVar3;
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ScheduleRandom","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  if (cVar6.Value == (string *)0x0) {
    bVar3 = false;
  }
  else {
    value_00._M_str = extraout_RDX_00;
    value_00._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value_00);
  }
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (bVar3 != false) {
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Random","");
    cmCTest::SetScheduleType(pcVar2,(string *)local_3d0);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Repeat","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (cVar6.Value == (string *)0x0) {
LAB_0019f828:
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ParallelLevel","");
    op = (string *)local_3d0;
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,op);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      op = (string *)(local_3d0._16_8_ + 1);
      operator_delete((void *)local_3d0._0_8_,(ulong)op);
    }
    if (cVar6.Value != (string *)0x0) {
      if ((cVar6.Value)->_M_string_length == 0) {
        level_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = 0;
        level_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)op;
        cmCTest::SetParallelLevel((this->super_cmCTestGenericHandler).CTest,level_00);
      }
      else {
        local_3f8._M_value = 0;
        bVar3 = cmStrToULong(cVar6.Value,&local_3f8._M_value);
        if (bVar3) {
          level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._8_8_ = 1;
          level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_3f8._M_value;
          cmCTest::SetParallelLevel((this->super_cmCTestGenericHandler).CTest,level);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"ParallelLevel invalid value: ",0x1d);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3d0,((cVar6.Value)->_M_dataplus)._M_p,
                              (cVar6.Value)->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x233,(char *)local_1a0._0_8_,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._0_8_ != local_190) {
            operator_delete((void *)local_1a0._0_8_,
                            CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                     local_190[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
        }
        if (!bVar3) goto LAB_0019fdc3;
      }
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"StopOnFailure","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"LabelRegularExpression","")
    ;
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&this->super_cmCTestGenericHandler,(string *)local_3d0);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0,&this->IncludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeLabelRegularExpression","");
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&this->super_cmCTestGenericHandler,(string *)local_3d0);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0,&this->ExcludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"IncludeRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      this->UseIncludeRegExpFlag = true;
      std::__cxx11::string::_M_assign((string *)&this->IncludeRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      this->UseExcludeRegExpFlag = true;
      this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
      std::__cxx11::string::_M_assign((string *)&this->ExcludeRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeFixtureRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeFixtureSetupRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureSetupRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeFixtureCleanupRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureCleanupRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ResourceSpecFile","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"TestListFile","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->TestListFile);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ExcludeTestListFile","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeTestListFile);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"RerunFailed","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if (cVar6.Value == (string *)0x0) {
      bVar3 = false;
    }
    else {
      value_01._M_str = extraout_RDX_01;
      value_01._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
      bVar3 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value_01);
    }
    this->RerunFailed = bVar3;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    bVar3 = true;
  }
  else {
    local_1c0 = (char *)0x0;
    local_1b0 = (char *)0x0;
    local_1a8 = 0;
    memset((RegularExpression *)local_3d0,0,0x20a);
    cmsys::RegularExpression::compile
              ((RegularExpression *)local_3d0,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    bVar3 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_3d0,((cVar6.Value)->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)local_3d0);
    if (bVar3) {
      if (local_3d0._16_8_ == 0) {
        local_1a0._0_8_ = local_190;
        local_1a0._8_8_ = (pointer)0x0;
        local_190[0]._M_local_buf[0] = '\0';
      }
      else {
        local_1a0._0_8_ = local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,local_3d0._16_8_,local_2c0);
      }
      local_3d8 = 1;
      cmStrToULong((string *)local_1a0,&local_3d8);
      this->RepeatCount = (int)local_3d8;
      if (1 < (int)local_3d8) {
        if ((char *)local_3d0._8_8_ == (char *)0x0) {
          local_3f8._M_value = (unsigned_long)&local_3e8;
          local_3f0 = 0;
          local_3e8 = 0;
        }
        else {
          local_3f8._M_value = (unsigned_long)&local_3e8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,local_3d0._8_8_,local_2c8);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_3f8._M_value);
        if (iVar4 == 0) {
          RVar5 = UntilFail;
LAB_0019f7cb:
          this->RepeatMode = RVar5;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_3f8._M_value);
          if (iVar4 == 0) {
            RVar5 = UntilPass;
            goto LAB_0019f7cb;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_3f8._M_value);
          if (iVar4 == 0) {
            RVar5 = AfterTimeout;
            goto LAB_0019f7cb;
          }
        }
        if ((undefined1 *)local_3f8._M_value != &local_3e8) {
          operator_delete((void *)local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._0_8_ != local_190) {
        operator_delete((void *)local_1a0._0_8_,
                        CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                 local_190[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Repeat option invalid value: ",0x1d);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,((cVar6.Value)->_M_dataplus)._M_p,
                          (cVar6.Value)->_M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x225,(char *)local_3f8,false);
      if ((undefined1 *)local_3f8._M_value != &local_3e8) {
        operator_delete((void *)local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    if (local_1b0 != (char *)0x0) {
      operator_delete__(local_1b0);
    }
    if (bVar3) goto LAB_0019f828;
LAB_0019fdc3:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(this->GetOption("UseUnion").IsOn());
  if (this->GetOption("ScheduleRandom").IsOn()) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(*repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << *repeat << std::endl);
      return false;
    }
  }
  if (cmValue parallelLevel = this->GetOption("ParallelLevel")) {
    if (parallelLevel.IsEmpty()) {
      // An empty value tells ctest to choose a default.
      this->CTest->SetParallelLevel(cm::nullopt);
    } else {
      // A non-empty value must be a non-negative integer.
      unsigned long plevel = 0;
      if (!cmStrToULong(*parallelLevel, &plevel)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "ParallelLevel invalid value: " << *parallelLevel
                                                   << std::endl);
        return false;
      }
      this->CTest->SetParallelLevel(plevel);
    }
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(*val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(*val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  val = this->GetOption("TestListFile");
  if (val) {
    this->TestListFile = val;
  }
  val = this->GetOption("ExcludeTestListFile");
  if (val) {
    this->ExcludeTestListFile = val;
  }
  this->SetRerunFailed(this->GetOption("RerunFailed").IsOn());

  return true;
}